

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

int jmp_patchtestreg(FuncState *fs,BCPos pc,BCReg reg)

{
  uint uVar1;
  BCInsLine *pBVar2;
  int iVar3;
  char cVar4;
  ulong uVar5;
  
  pBVar2 = fs->bcbase;
  iVar3 = 0;
  uVar5 = (ulong)(pc - 1);
  if (pc == 0) {
    uVar5 = 0;
  }
  uVar1 = pBVar2[uVar5].ins;
  cVar4 = (char)reg;
  if ((uVar1 & 0xfe) != 0xc) {
    if ((~uVar1 & 0xff00) == 0) {
      if (reg == 0xff) {
        pBVar2[uVar5].ins = (uint)*(byte *)((long)&pBVar2[pc].ins + 1) << 8 | 0x80000058;
        return 1;
      }
      *(char *)((long)&pBVar2[uVar5].ins + 1) = cVar4;
      iVar3 = 1;
      if (*(byte *)((long)&pBVar2[uVar5 + 1].ins + 1) <= reg) {
        *(char *)((long)&pBVar2[uVar5 + 1].ins + 1) = cVar4 + '\x01';
      }
    }
    return iVar3;
  }
  if ((reg == 0xff) || (uVar1 >> 0x10 == reg)) {
    *(byte *)&pBVar2[uVar5].ins = (byte)uVar1 | 2;
    *(undefined1 *)((long)&pBVar2[uVar5].ins + 1) = 0;
  }
  else {
    *(char *)((long)&pBVar2[uVar5].ins + 1) = cVar4;
  }
  return 1;
}

Assistant:

static int jmp_patchtestreg(FuncState *fs, BCPos pc, BCReg reg)
{
  BCInsLine *ilp = &fs->bcbase[pc >= 1 ? pc-1 : pc];
  BCOp op = bc_op(ilp->ins);
  if (op == BC_ISTC || op == BC_ISFC) {
    if (reg != NO_REG && reg != bc_d(ilp->ins)) {
      setbc_a(&ilp->ins, reg);
    } else {  /* Nothing to store or already in the right register. */
      setbc_op(&ilp->ins, op+(BC_IST-BC_ISTC));
      setbc_a(&ilp->ins, 0);
    }
  } else if (bc_a(ilp->ins) == NO_REG) {
    if (reg == NO_REG) {
      ilp->ins = BCINS_AJ(BC_JMP, bc_a(fs->bcbase[pc].ins), 0);
    } else {
      setbc_a(&ilp->ins, reg);
      if (reg >= bc_a(ilp[1].ins))
	setbc_a(&ilp[1].ins, reg+1);
    }
  } else {
    return 0;  /* Cannot patch other instructions. */
  }
  return 1;
}